

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

FFSFile open_FFSfile(char *path,char *flags)

{
  void *pvVar1;
  char *in_RDI;
  char msg [128];
  int index;
  int raw;
  int allow_output;
  int allow_input;
  FFSFile f;
  void *file;
  char acStackY_b8 [24];
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  FFSFile local_8;
  
  parse_flags(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
              in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  pvVar1 = (*ffs_file_open_func)(in_RDI,"w",(int *)0x0,(int *)0x0);
  if (pvVar1 == (void *)0x0) {
    snprintf(acStackY_b8,0x80,"open_FFSfile failed for %s :",in_RDI);
    perror(acStackY_b8);
    local_8 = (FFSFile)0x0;
  }
  else {
    local_8 = open_FFSfd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  return local_8;
}

Assistant:

extern FFSFile
open_FFSfile(const char *path, const char *flags)
{
    void *file;
    FFSFile f;
    int allow_input = 0, allow_output = 0;
    int raw, index;

    parse_flags(flags, &allow_input, &allow_output, &raw, &index);

    if (allow_input && allow_output) {
	file = (FFSFile) (ffs_file_open_func)(path, "a", NULL, NULL);
	if (file == (void*)0) {
	    /* if open for append failed, try creating it */
	    file = (FFSFile)(ffs_file_open_func)(path, "w", NULL, NULL);
	}
    } else if (allow_input) {
	file = (FFSFile)(ffs_file_open_func)(path, "r", NULL, NULL);
    } else {
	file = (FFSFile)(ffs_file_open_func)(path, "w", NULL, NULL);
    }

    if (file == NULL) {
	char msg[128];
	(void) snprintf(msg, sizeof(msg), "open_FFSfile failed for %s :", path);
	perror(msg);
	return NULL;
    }
    f = open_FFSfd(file, flags);
    return f;
}